

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int declClose(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  if (tok == 0x11) {
    state->handler = internalSubset;
  }
  else if (tok != 0xf) {
    state->handler = error;
    return -1;
  }
  return state->role_none;
}

Assistant:

static int PTRCALL
declClose(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
          const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return state->role_none;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return state->role_none;
  }
  return common(state, tok);
}